

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

void __thiscall
phpconvert::ZendParser::generatePreparedTypeFull
          (ZendParser *this,PreparedType *outPrep,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVect)

{
  StringHelper *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator local_211;
  string local_210;
  undefined8 local_1f0;
  size_t size;
  string tmpString;
  stringstream stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmpVect_local;
  PreparedType *outPrep_local;
  ZendParser *this_local;
  
  local_20 = tmpVect;
  tmpVect_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)outPrep;
  outPrep_local = (PreparedType *)this;
  bVar2 = hasDelimeter(this,outPrep);
  if (bVar2) {
    std::operator+(&local_40,"\\",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   tmpVect_local);
    std::__cxx11::string::operator=((string *)(tmpVect_local + 4),(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)(tmpString.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&size);
    pvVar1 = local_20;
    local_1f0 = 1;
    this_00 = this->stringHelper;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,"_",&local_211);
    StringHelper::split(this_00,pvVar1,&local_210,(string *)tmpVect_local);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    pvVar1 = local_20;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvVar1,sVar3 - 1);
    std::__cxx11::string::operator=((string *)&size,(string *)pvVar4);
    toLower(this,(string *)&size);
    bVar2 = isKeyword(this,(string *)&size);
    if (bVar2) {
      local_1f0 = 2;
    }
    extractNamespace(this,(string *)tmpVect_local,(string *)&size,local_20);
    generateAlias(&local_268,this,(string *)tmpVect_local,(uint)local_1f0,local_20);
    std::operator+(&local_248,"_",&local_268);
    std::__cxx11::string::operator+=((string *)&size,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    generateNamespace(this,(string *)&size,(string *)(tmpVect_local + 4));
    std::operator+(&local_288,"\\",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (tmpVect_local + 4));
    std::__cxx11::string::operator=((string *)(tmpVect_local + 4),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::stringstream::~stringstream((stringstream *)(tmpString.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void ZendParser::generatePreparedTypeFull(PreparedType &outPrep,
                                              vector<string> &tmpVect) {
        if (hasDelimeter(outPrep)) {
            outPrep.alias = NAMESPACE_SEPARATOR + outPrep.type; //extract const - ns sep.
            return;
        }

        stringstream stream;
        string tmpString;
        size_t size = 1;

        this->stringHelper->split(tmpVect, DELIMETER, outPrep.type);

        tmpString = tmpVect[tmpVect.size() - 1];
        toLower(tmpString);

        if (isKeyword(tmpString)) {
            size = 2;
        }

        extractNamespace(outPrep.type, tmpString, tmpVect);
        tmpString += DELIMETER + generateAlias(outPrep.type, size, tmpVect);
        generateNamespace(tmpString, outPrep.alias);

        outPrep.alias = NAMESPACE_SEPARATOR + outPrep.alias;
    }